

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::parser::ChaiScript_Parser::buildInt
          (ChaiScript_Parser *this,int base,string *t_val,bool prefixed)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  _Alloc_hider __nptr;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  bool bVar9;
  size_type sVar10;
  byte bVar11;
  Boxed_Value BVar12;
  undefined1 auVar13 [12];
  string val;
  pointer local_60;
  int local_58;
  int local_54;
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  
  sVar1 = t_val->_M_string_length;
  if (sVar1 == 0) {
    bVar4 = false;
    bVar3 = false;
    bVar9 = false;
  }
  else {
    bVar9 = false;
    bVar3 = false;
    bVar4 = false;
    sVar10 = sVar1;
    do {
      bVar11 = (t_val->_M_dataplus)._M_p[sVar10 - 1] & 0xdf;
      if (bVar11 == 0x55) {
        bVar9 = true;
      }
      else {
        if (bVar11 != 0x4c) break;
        if (bVar3) {
          bVar4 = true;
        }
        bVar3 = true;
      }
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
  }
  local_58 = base;
  if (prefixed) {
    pcVar2 = (t_val->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_50,pcVar2 + 2,pcVar2 + sVar1);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (t_val->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + sVar1);
  }
  __nptr._M_p = local_50._M_dataplus._M_p;
  piVar6 = __errno_location();
  local_54 = *piVar6;
  *piVar6 = 0;
  pcVar7 = (char *)strtoll(__nptr._M_p,&local_60,local_58);
  if (local_60 == __nptr._M_p) {
    auVar13 = std::__throw_invalid_argument("stoll");
    if (auVar13._8_4_ != 1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(auVar13._0_8_);
    }
    __cxa_begin_catch(auVar13._0_8_);
    local_60 = (pointer)std::__cxx11::stoull(&local_50,(size_t *)0x0,local_58);
    detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_60);
    __cxa_end_catch();
    _Var8._M_pi = extraout_RDX_00;
    goto LAB_00193882;
  }
  if (*piVar6 == 0) {
LAB_001937b0:
    *piVar6 = local_54;
  }
  else if (*piVar6 == 0x22) {
    pcVar7 = (char *)std::__throw_out_of_range("stoll");
    goto LAB_001937b0;
  }
  iVar5 = (int)pcVar7;
  local_60 = pcVar7;
  if (bVar9) {
    if ((bool)((ulong)pcVar7 >> 0x20 != 0 | bVar3)) {
      if (bVar4) {
        BVar12 = detail::const_var_impl<unsigned_long_long>
                           ((detail *)this,(unsigned_long_long *)&local_60);
        _Var8._M_pi = BVar12.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      else {
        BVar12 = detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_60);
        _Var8._M_pi = BVar12.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      goto LAB_00193882;
    }
  }
  else {
    if ((char *)(long)iVar5 == pcVar7 && !bVar3) {
      local_60 = (pointer)CONCAT44(local_60._4_4_,iVar5);
      BVar12 = detail::const_var_impl<int>((detail *)this,(int *)&local_60);
      _Var8._M_pi = BVar12.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      goto LAB_00193882;
    }
    if ((local_58 == 10) || ((ulong)pcVar7 >> 0x20 != 0 || bVar3)) {
      if (bVar4) {
        BVar12 = detail::const_var_impl<long_long>((detail *)this,(longlong *)&local_60);
        _Var8._M_pi = BVar12.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      else {
        BVar12 = detail::const_var_impl<long>((detail *)this,(long *)&local_60);
        _Var8._M_pi = BVar12.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      goto LAB_00193882;
    }
  }
  local_60 = (pointer)CONCAT44(local_60._4_4_,iVar5);
  BVar12 = detail::const_var_impl<unsigned_int>((detail *)this,(uint *)&local_60);
  _Var8._M_pi = BVar12.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_00193882:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX;
  }
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildInt(const int base, const std::string &t_val, const bool prefixed)
      {
        bool unsigned_ = false;
        bool long_ = false;
        bool longlong_ = false;

        auto i = t_val.size();

        for (; i > 0; --i)
        {
          const char val = t_val[i-1];

          if (val == 'u' || val == 'U')
          {
            unsigned_ = true;
          } else if (val == 'l' || val == 'L') {
            if (long_)
            {
              longlong_ = true;
            }

            long_ = true;
          } else {
            break;
          }
        }

        const auto val = prefixed?std::string(t_val.begin()+2,t_val.end()):t_val;

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-compare"

#ifdef CHAISCRIPT_CLANG
#pragma GCC diagnostic ignored "-Wtautological-compare"
#endif

#endif

        try {
          auto u = std::stoll(val,nullptr,base);


          if (!unsigned_ && !long_ && u >= std::numeric_limits<int>::min() && u <= std::numeric_limits<int>::max()) {
            return const_var(static_cast<int>(u));
          } else if ((unsigned_ || base != 10) && !long_ && u >= std::numeric_limits<unsigned int>::min() && u <= std::numeric_limits<unsigned int>::max()) {
            return const_var(static_cast<unsigned int>(u));
          } else if (!unsigned_ && !longlong_ && u >= std::numeric_limits<long>::min() && u <= std::numeric_limits<long>::max()) {
            return const_var(static_cast<long>(u));
          } else if ((unsigned_ || base != 10) && !longlong_ && u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
            return const_var(static_cast<unsigned long>(u));
          } else if (!unsigned_ && u >= std::numeric_limits<long long>::min() && u <= std::numeric_limits<long long>::max()) {
            return const_var(static_cast<long long>(u));
          } else {
            return const_var(static_cast<unsigned long long>(u));
          }

        } catch (const std::out_of_range &) {
          // too big to be signed
          try {
            auto u = std::stoull(val,nullptr,base);

            if (u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
              return const_var(static_cast<unsigned long>(u));
            } else {
              return const_var(static_cast<unsigned long long>(u));
            }
          } catch (const std::out_of_range &) {
            // it's just simply too big
            return const_var(std::numeric_limits<long long>::max());
          }
        }

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif

      }